

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::BondTypesSectionParser::parseLine
          (BondTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  BondType *bondType;
  BondTypeParser btParser;
  string at1;
  string remainder;
  string at2;
  StringTokenizer tokenizer;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
  _Stack_108;
  string local_d8;
  string local_b8;
  string local_98;
  StringTokenizer local_78;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&_Stack_108," ;\t\n\r",(allocator<char> *)&local_d8);
  StringTokenizer::StringTokenizer(&local_78,line,(string *)&_Stack_108);
  std::__cxx11::string::~string((string *)&_Stack_108);
  BondTypeParser::BondTypeParser((BondTypeParser *)&_Stack_108);
  iVar1 = StringTokenizer::countTokens(&local_78);
  if (iVar1 < 4) {
    snprintf(painCave.errMsg,2000,"BondTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  StringTokenizer::nextToken_abi_cxx11_(&local_d8,&local_78);
  StringTokenizer::nextToken_abi_cxx11_(&local_98,&local_78);
  StringTokenizer::getRemainingString_abi_cxx11_(&local_b8,&local_78);
  bondType = BondTypeParser::parseLine
                       ((BondTypeParser *)&_Stack_108,&local_b8,
                        (this->options_->BondForceConstantScaling).data_);
  if (bondType != (BondType *)0x0) {
    ForceField::addBondType(ff,&local_d8,&local_98,bondType);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
  ::~_Rb_tree(&_Stack_108);
  StringTokenizer::~StringTokenizer(&local_78);
  return;
}

Assistant:

void BondTypesSectionParser::parseLine(ForceField& ff,
                                         const std::string& line, int lineNo) {
    StringTokenizer tokenizer(line);
    BondTypeParser btParser;
    BondType* bondType = NULL;
    int nTokens        = tokenizer.countTokens();

    if (nTokens < 4) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondTypesSectionParser Error: Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }

    std::string at1       = tokenizer.nextToken();
    std::string at2       = tokenizer.nextToken();
    std::string remainder = tokenizer.getRemainingString();
    RealType kScale       = options_.getBondForceConstantScaling();

    try {
      bondType = btParser.parseLine(remainder, kScale);
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondTypesSectionParser Error: %s "
               "at line %d\n",
               e.what(), lineNo);
      painCave.isFatal = 1;
      simError();
    }

    if (bondType != NULL) { ff.addBondType(at1, at2, bondType); }
  }